

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sps.c
# Opt level: O3

MPP_RET parser_sps(BitReadCtx_t *p_bitctx,H264_SPS_t *cur_sps,H264_DecCtx_t *p_Dec)

{
  int iVar1;
  MPP_RET MVar2;
  uint uVar3;
  undefined8 uVar4;
  long lVar5;
  RK_S32 _out;
  uint local_2c;
  
  cur_sps->chroma_format_idc = 1;
  cur_sps->bit_depth_luma_minus8 = 0;
  cur_sps->bit_depth_chroma_minus8 = 0;
  cur_sps->qpprime_y_zero_transform_bypass_flag = 0;
  cur_sps->separate_colour_plane_flag = 0;
  cur_sps->log2_max_pic_order_cnt_lsb_minus4 = 0;
  cur_sps->delta_pic_order_always_zero_flag = 0;
  (p_Dec->errctx).un_spt_flag = 0;
  MVar2 = mpp_read_bits(p_bitctx,8,(RK_S32 *)&local_2c);
  p_bitctx->ret = MVar2;
  if (MVar2 != MPP_OK) {
    return MVar2;
  }
  cur_sps->profile_idc = local_2c;
  if ((((0x3e < local_2c - 0x42) ||
       ((0x4110100400400801U >> ((ulong)(local_2c - 0x42) & 0x3f) & 1) == 0)) && (local_2c != 0x2c))
     && (local_2c != 0xf4)) {
    if (((byte)h264d_debug & 4) == 0) {
      return MPP_ERR_VALUE;
    }
    uVar4 = 0xc6;
LAB_0018f1db:
    _mpp_log_l(4,"h264d_sps","value error(%d).\n",(char *)0x0,uVar4);
    return MPP_ERR_VALUE;
  }
  MVar2 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_2c);
  p_bitctx->ret = MVar2;
  if (MVar2 != MPP_OK) {
    return MVar2;
  }
  cur_sps->constrained_set0_flag = local_2c;
  MVar2 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_2c);
  p_bitctx->ret = MVar2;
  if (MVar2 != MPP_OK) {
    return MVar2;
  }
  cur_sps->constrained_set1_flag = local_2c;
  MVar2 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_2c);
  p_bitctx->ret = MVar2;
  if (MVar2 != MPP_OK) {
    return MVar2;
  }
  cur_sps->constrained_set2_flag = local_2c;
  MVar2 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_2c);
  p_bitctx->ret = MVar2;
  if (MVar2 != MPP_OK) {
    return MVar2;
  }
  cur_sps->constrained_set3_flag = local_2c;
  MVar2 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_2c);
  p_bitctx->ret = MVar2;
  if (MVar2 != MPP_OK) {
    return MVar2;
  }
  cur_sps->constrained_set4_flag = local_2c;
  MVar2 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_2c);
  p_bitctx->ret = MVar2;
  if (MVar2 != MPP_OK) {
    return MVar2;
  }
  cur_sps->constrained_set5_flag = local_2c;
  MVar2 = mpp_read_bits(p_bitctx,2,(RK_S32 *)&local_2c);
  p_bitctx->ret = MVar2;
  if (MVar2 != MPP_OK) {
    return MVar2;
  }
  if (((((byte)h264d_debug & 2) != 0) && (local_2c != 0)) &&
     (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,"temp == 0","parser_sps"
                 ,0xce), (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0018f9f4;
  MVar2 = mpp_read_bits(p_bitctx,8,(RK_S32 *)&local_2c);
  p_bitctx->ret = MVar2;
  if (MVar2 != MPP_OK) {
    return MVar2;
  }
  cur_sps->level_idc = local_2c;
  MVar2 = mpp_read_ue(p_bitctx,&local_2c);
  p_bitctx->ret = MVar2;
  if (MVar2 != MPP_OK) {
    return MVar2;
  }
  cur_sps->seq_parameter_set_id = local_2c;
  if (0x1f < local_2c) {
    cur_sps->seq_parameter_set_id = 0;
  }
  iVar1 = cur_sps->profile_idc;
  if (((iVar1 - 0x53U < 0x38) && ((0x80208808020009U >> ((ulong)(iVar1 - 0x53U) & 0x3f) & 1) != 0))
     || ((iVar1 == 0xf4 || (iVar1 == 0x2c)))) {
    MVar2 = mpp_read_ue(p_bitctx,&local_2c);
    p_bitctx->ret = MVar2;
    if (MVar2 != MPP_OK) {
      return MVar2;
    }
    cur_sps->chroma_format_idc = local_2c;
    if (3 < (int)local_2c) {
      if (((byte)h264d_debug & 4) == 0) {
        return MPP_ERR_VALUE;
      }
      uVar4 = 0xdb;
      goto LAB_0018f1db;
    }
    if (local_2c == 3) {
      if (((byte)h264d_debug & 1) != 0) {
        _mpp_log_l(4,"h264d_sps","ERROR: Not support chroma_format_idc %d",(char *)0x0,3);
      }
LAB_0018f325:
      (p_Dec->errctx).un_spt_flag = 2;
      return MPP_ERR_UNKNOW;
    }
    MVar2 = mpp_read_ue(p_bitctx,&local_2c);
    p_bitctx->ret = MVar2;
    if (MVar2 != MPP_OK) {
      return MVar2;
    }
    cur_sps->bit_depth_luma_minus8 = local_2c;
    if ((6 < (int)local_2c && ((byte)h264d_debug & 2) != 0) &&
       (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "cur_sps->bit_depth_luma_minus8 < 7","parser_sps",0xe3),
       (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0018f9f4;
    MVar2 = mpp_read_ue(p_bitctx,&local_2c);
    p_bitctx->ret = MVar2;
    if (MVar2 != MPP_OK) {
      return MVar2;
    }
    cur_sps->bit_depth_chroma_minus8 = local_2c;
    if ((6 < (int)local_2c && ((byte)h264d_debug & 2) != 0) &&
       (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "cur_sps->bit_depth_chroma_minus8 < 7","parser_sps",0xe5),
       (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0018f9f4;
    MVar2 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_2c);
    p_bitctx->ret = MVar2;
    if (MVar2 != MPP_OK) {
      return MVar2;
    }
    cur_sps->qpprime_y_zero_transform_bypass_flag = local_2c;
    if (local_2c == 1) {
      if (((byte)h264d_debug & 1) != 0) {
        _mpp_log_l(4,"h264d_sps","ERROR: Not support high 4:4:4 lossless mode",(char *)0x0);
      }
      goto LAB_0018f325;
    }
    MVar2 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_2c);
    p_bitctx->ret = MVar2;
    if (MVar2 != MPP_OK) {
      return MVar2;
    }
    cur_sps->seq_scaling_matrix_present_flag = local_2c;
    if (local_2c != 0) {
      if (((byte)h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_sps","Scaling matrix present.",(char *)0x0);
      }
      MVar2 = parse_sps_scalinglists(p_bitctx,cur_sps);
      if (MVar2 != MPP_OK) {
        _mpp_log_l(4,"h264d_sps"," parse_sps_scaling_list error.","parser_sps");
      }
    }
  }
  MVar2 = mpp_read_ue(p_bitctx,&local_2c);
  p_bitctx->ret = MVar2;
  if (MVar2 != MPP_OK) {
    return MVar2;
  }
  cur_sps->log2_max_frame_num_minus4 = local_2c;
  if ((0xc < (int)local_2c && ((byte)h264d_debug & 2) != 0) &&
     (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "cur_sps->log2_max_frame_num_minus4 < 13","parser_sps",0xf5),
     (mpp_debug._3_1_ & 0x10) != 0)) {
LAB_0018f9f4:
    abort();
  }
  MVar2 = mpp_read_ue(p_bitctx,&local_2c);
  p_bitctx->ret = MVar2;
  if (MVar2 != MPP_OK) {
    return MVar2;
  }
  cur_sps->pic_order_cnt_type = local_2c;
  uVar3 = local_2c;
  if (2 < (int)local_2c && ((byte)h264d_debug & 2) != 0) {
    _mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
               "cur_sps->pic_order_cnt_type < 3","parser_sps",0xf7);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0018f9f4;
    uVar3 = cur_sps->pic_order_cnt_type;
  }
  cur_sps->log2_max_pic_order_cnt_lsb_minus4 = 0;
  cur_sps->delta_pic_order_always_zero_flag = 0;
  if (uVar3 == 1) {
    MVar2 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_2c);
    p_bitctx->ret = MVar2;
    if (MVar2 != MPP_OK) {
      return MVar2;
    }
    cur_sps->delta_pic_order_always_zero_flag = local_2c;
    MVar2 = mpp_read_se(p_bitctx,(RK_S32 *)&local_2c);
    p_bitctx->ret = MVar2;
    if (MVar2 != MPP_OK) {
      return MVar2;
    }
    cur_sps->offset_for_non_ref_pic = local_2c;
    MVar2 = mpp_read_se(p_bitctx,(RK_S32 *)&local_2c);
    p_bitctx->ret = MVar2;
    if (MVar2 != MPP_OK) {
      return MVar2;
    }
    cur_sps->offset_for_top_to_bottom_field = local_2c;
    MVar2 = mpp_read_ue(p_bitctx,&local_2c);
    p_bitctx->ret = MVar2;
    if (MVar2 != MPP_OK) {
      return MVar2;
    }
    cur_sps->num_ref_frames_in_pic_order_cnt_cycle = local_2c;
    if (0xff < (int)local_2c) {
      if (((byte)h264d_debug & 4) == 0) {
        return MPP_ERR_VALUE;
      }
      uVar4 = 0x103;
      goto LAB_0018f1db;
    }
    if (0 < (int)local_2c) {
      lVar5 = 0;
      do {
        MVar2 = mpp_read_se(p_bitctx,(RK_S32 *)&local_2c);
        p_bitctx->ret = MVar2;
        if (MVar2 != MPP_OK) {
          return MVar2;
        }
        cur_sps->offset_for_ref_frame[lVar5] = local_2c;
        cur_sps->expected_delta_per_pic_order_cnt_cycle =
             cur_sps->expected_delta_per_pic_order_cnt_cycle + local_2c;
        lVar5 = lVar5 + 1;
      } while (lVar5 < cur_sps->num_ref_frames_in_pic_order_cnt_cycle);
    }
  }
  else if (uVar3 == 0) {
    MVar2 = mpp_read_ue(p_bitctx,&local_2c);
    p_bitctx->ret = MVar2;
    if (MVar2 != MPP_OK) {
      return MVar2;
    }
    cur_sps->log2_max_pic_order_cnt_lsb_minus4 = local_2c;
    if ((0xc < (int)local_2c && ((byte)h264d_debug & 2) != 0) &&
       (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "cur_sps->log2_max_pic_order_cnt_lsb_minus4 < 13","parser_sps",0xfd),
       (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0018f9f4;
  }
  MVar2 = mpp_read_ue(p_bitctx,&local_2c);
  p_bitctx->ret = MVar2;
  if (MVar2 == MPP_OK) {
    cur_sps->max_num_ref_frames = local_2c;
    MVar2 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_2c);
    p_bitctx->ret = MVar2;
    if (MVar2 == MPP_OK) {
      cur_sps->gaps_in_frame_num_value_allowed_flag = local_2c;
      MVar2 = mpp_read_ue(p_bitctx,&local_2c);
      p_bitctx->ret = MVar2;
      if (MVar2 == MPP_OK) {
        cur_sps->pic_width_in_mbs_minus1 = local_2c;
        MVar2 = mpp_read_ue(p_bitctx,&local_2c);
        p_bitctx->ret = MVar2;
        if (MVar2 == MPP_OK) {
          cur_sps->pic_height_in_map_units_minus1 = local_2c;
          MVar2 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_2c);
          p_bitctx->ret = MVar2;
          if (MVar2 == MPP_OK) {
            cur_sps->frame_mbs_only_flag = local_2c;
            if (local_2c == 0) {
              MVar2 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_2c);
              p_bitctx->ret = MVar2;
              if (MVar2 != MPP_OK) {
                return MVar2;
              }
              cur_sps->mb_adaptive_frame_field_flag = local_2c;
            }
            MVar2 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_2c);
            p_bitctx->ret = MVar2;
            if (MVar2 == MPP_OK) {
              cur_sps->direct_8x8_inference_flag = local_2c;
              MVar2 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_2c);
              p_bitctx->ret = MVar2;
              if (MVar2 == MPP_OK) {
                cur_sps->frame_cropping_flag = local_2c;
                if (local_2c != 0) {
                  MVar2 = mpp_read_ue(p_bitctx,&local_2c);
                  p_bitctx->ret = MVar2;
                  if (MVar2 != MPP_OK) {
                    return MVar2;
                  }
                  cur_sps->frame_crop_left_offset = local_2c;
                  MVar2 = mpp_read_ue(p_bitctx,&local_2c);
                  p_bitctx->ret = MVar2;
                  if (MVar2 != MPP_OK) {
                    return MVar2;
                  }
                  cur_sps->frame_crop_right_offset = local_2c;
                  MVar2 = mpp_read_ue(p_bitctx,&local_2c);
                  p_bitctx->ret = MVar2;
                  if (MVar2 != MPP_OK) {
                    return MVar2;
                  }
                  cur_sps->frame_crop_top_offset = local_2c;
                  MVar2 = mpp_read_ue(p_bitctx,&local_2c);
                  p_bitctx->ret = MVar2;
                  if (MVar2 != MPP_OK) {
                    return MVar2;
                  }
                  cur_sps->frame_crop_bottom_offset = local_2c;
                }
                MVar2 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_2c);
                p_bitctx->ret = MVar2;
                if (MVar2 == MPP_OK) {
                  cur_sps->vui_parameters_present_flag = local_2c;
                  if (local_2c != 0) {
                    (cur_sps->vui_seq_parameters).matrix_coefficients = 2;
                    read_VUI(p_bitctx,&cur_sps->vui_seq_parameters);
                  }
                  cur_sps->Valid = 1;
                  MVar2 = MPP_OK;
                }
              }
            }
          }
        }
      }
    }
  }
  return MVar2;
}

Assistant:

static MPP_RET parser_sps(BitReadCtx_t *p_bitctx, H264_SPS_t *cur_sps, H264_DecCtx_t *p_Dec)
{
    RK_S32 i = 0, temp = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    //!< init Fidelity Range Extensions stuff
    cur_sps->chroma_format_idc       = 1;
    cur_sps->bit_depth_luma_minus8   = 0;
    cur_sps->bit_depth_chroma_minus8 = 0;
    cur_sps->qpprime_y_zero_transform_bypass_flag = 0;
    cur_sps->separate_colour_plane_flag           = 0;
    cur_sps->log2_max_pic_order_cnt_lsb_minus4    = 0;
    cur_sps->delta_pic_order_always_zero_flag     = 0;
    p_Dec->errctx.un_spt_flag = 0; // init unspport flag first

    READ_BITS(p_bitctx, 8, &cur_sps->profile_idc);
    VAL_CHECK (ret, (cur_sps->profile_idc == H264_PROFILE_BASELINE)
               || (cur_sps->profile_idc == H264_PROFILE_MAIN)
               || (cur_sps->profile_idc == H264_PROFILE_EXTENDED)
               || (cur_sps->profile_idc == H264_PROFILE_HIGH)
               || (cur_sps->profile_idc == H264_PROFILE_HIGH10)
               || (cur_sps->profile_idc == H264_PROFILE_HIGH422)
               || (cur_sps->profile_idc == H264_PROFILE_HIGH444)
               || (cur_sps->profile_idc == H264_PROFILE_FREXT_CAVLC444)
               || (cur_sps->profile_idc == H264_PROFILE_MVC_HIGH)
               || (cur_sps->profile_idc == H264_PROFILE_STEREO_HIGH)
              );
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set0_flag);
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set1_flag);
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set2_flag);
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set3_flag);
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set4_flag);
    READ_ONEBIT(p_bitctx, &cur_sps->constrained_set5_flag);
    READ_BITS(p_bitctx, 2, &temp);  //!< reserved_zero_2bits
    ASSERT(temp == 0);
    READ_BITS(p_bitctx, 8, &cur_sps->level_idc);
    READ_UE(p_bitctx, &cur_sps->seq_parameter_set_id);
    if (cur_sps->seq_parameter_set_id >= MAXSPS) {
        cur_sps->seq_parameter_set_id = 0;
    }
    if (cur_sps->profile_idc == 100 || cur_sps->profile_idc == 110
        || cur_sps->profile_idc == 122 || cur_sps->profile_idc == 244
        || cur_sps->profile_idc == 44  || cur_sps->profile_idc == 83
        || cur_sps->profile_idc == 86  || cur_sps->profile_idc == 118
        || cur_sps->profile_idc == 128 || cur_sps->profile_idc == 138) {
        READ_UE(p_bitctx, &cur_sps->chroma_format_idc);
        /* check invalid chroma format idc */
        VAL_CHECK (ret, (cur_sps->chroma_format_idc <= H264_CHROMA_444));
        /* TODO: check unsupport chroma format by hardware capacity */
        if (cur_sps->chroma_format_idc > H264_CHROMA_422) {
            H264D_ERR("ERROR: Not support chroma_format_idc %d", cur_sps->chroma_format_idc);
            p_Dec->errctx.un_spt_flag = MPP_FRAME_ERR_UNSUPPORT;
            goto __FAILED;
        }
        READ_UE(p_bitctx, &cur_sps->bit_depth_luma_minus8);
        ASSERT(cur_sps->bit_depth_luma_minus8 < 7);
        READ_UE(p_bitctx, &cur_sps->bit_depth_chroma_minus8);
        ASSERT(cur_sps->bit_depth_chroma_minus8 < 7);
        READ_ONEBIT(p_bitctx, &cur_sps->qpprime_y_zero_transform_bypass_flag);
        if (cur_sps->qpprime_y_zero_transform_bypass_flag == 1) {
            H264D_ERR("ERROR: Not support high 4:4:4 lossless mode");
            p_Dec->errctx.un_spt_flag = MPP_FRAME_ERR_UNSUPPORT;
            goto __FAILED;
        }
        READ_ONEBIT(p_bitctx, &cur_sps->seq_scaling_matrix_present_flag);
        if (cur_sps->seq_scaling_matrix_present_flag) {
            H264D_WARNNING("Scaling matrix present.");
            if (parse_sps_scalinglists(p_bitctx, cur_sps)) {
                mpp_log_f(" parse_sps_scaling_list error.");
            }
        }
    }
    READ_UE(p_bitctx, &cur_sps->log2_max_frame_num_minus4);
    ASSERT(cur_sps->log2_max_frame_num_minus4 < 13);
    READ_UE(p_bitctx, &cur_sps->pic_order_cnt_type);
    ASSERT(cur_sps->pic_order_cnt_type < 3);

    cur_sps->log2_max_pic_order_cnt_lsb_minus4 = 0;
    cur_sps->delta_pic_order_always_zero_flag = 0;
    if (0 == cur_sps->pic_order_cnt_type) {
        READ_UE(p_bitctx, &cur_sps->log2_max_pic_order_cnt_lsb_minus4);
        ASSERT(cur_sps->log2_max_pic_order_cnt_lsb_minus4 < 13);
    } else if (1 == cur_sps->pic_order_cnt_type) {
        READ_ONEBIT(p_bitctx, &cur_sps->delta_pic_order_always_zero_flag);
        READ_SE(p_bitctx, &cur_sps->offset_for_non_ref_pic);
        READ_SE(p_bitctx, &cur_sps->offset_for_top_to_bottom_field);
        READ_UE(p_bitctx, &cur_sps->num_ref_frames_in_pic_order_cnt_cycle);
        VAL_CHECK(ret, cur_sps->num_ref_frames_in_pic_order_cnt_cycle < 256);
        for (i = 0; i < cur_sps->num_ref_frames_in_pic_order_cnt_cycle; ++i) {
            READ_SE(p_bitctx, &cur_sps->offset_for_ref_frame[i]);
            cur_sps->expected_delta_per_pic_order_cnt_cycle += cur_sps->offset_for_ref_frame[i];
        }
    }
    READ_UE(p_bitctx, &cur_sps->max_num_ref_frames);
    READ_ONEBIT(p_bitctx, &cur_sps->gaps_in_frame_num_value_allowed_flag);
    READ_UE(p_bitctx, &cur_sps->pic_width_in_mbs_minus1);
    READ_UE(p_bitctx, &cur_sps->pic_height_in_map_units_minus1);
    READ_ONEBIT(p_bitctx, &cur_sps->frame_mbs_only_flag);
    if (!cur_sps->frame_mbs_only_flag) {
        READ_ONEBIT(p_bitctx, &cur_sps->mb_adaptive_frame_field_flag);
    }
    READ_ONEBIT(p_bitctx, &cur_sps->direct_8x8_inference_flag);

    READ_ONEBIT(p_bitctx, &cur_sps->frame_cropping_flag);
    if (cur_sps->frame_cropping_flag) {
        READ_UE(p_bitctx, &cur_sps->frame_crop_left_offset);
        READ_UE(p_bitctx, &cur_sps->frame_crop_right_offset);
        READ_UE(p_bitctx, &cur_sps->frame_crop_top_offset);
        READ_UE(p_bitctx, &cur_sps->frame_crop_bottom_offset);
    }
    READ_ONEBIT(p_bitctx, &cur_sps->vui_parameters_present_flag);

    if (cur_sps->vui_parameters_present_flag) {
        init_VUI(&cur_sps->vui_seq_parameters);
        ret = read_VUI(p_bitctx, &cur_sps->vui_seq_parameters);
    }
    cur_sps->Valid = 1;
    (void)p_Dec;

    return ret = MPP_OK;
__BITREAD_ERR:
    ret = p_bitctx->ret;
__FAILED:
    return ret;
}